

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

void __thiscall
Table::insert_into(Table *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *fields)

{
  pointer pbVar1;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *this_00;
  vector<long,_std::allocator<long>_> *this_01;
  runtime_error *prVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  char (*pacVar6) [20];
  bool bVar7;
  allocator local_401;
  long record_number;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  fstream f;
  Record r;
  
  pbVar1 = (fields->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(fields->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  lVar5 = 0;
  while (bVar7 = lVar3 != 0, lVar3 = lVar3 + -1, bVar7) {
    if (0x13 < *(ulong *)((long)&pbVar1->_M_string_length + lVar5)) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                     this->MAX_FIELD_SIZE_EXCEEDED,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((fields->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar5));
      std::runtime_error::runtime_error(prVar2,(string *)&f);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar5 = lVar5 + 0x20;
  }
  get_filename_abi_cxx11_((string *)&f,this);
  bVar7 = bin_io::file_exists(_f);
  std::__cxx11::string::~string((string *)&f);
  if (!bVar7) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,this->CANNOT_FIND_TABLE);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::fstream::fstream(&f);
  get_filename_abi_cxx11_((string *)&r,this);
  bin_io::open_fileW(&f,(char *)r._0_8_);
  std::__cxx11::string::~string((string *)&r);
  if ((long)(fields->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(fields->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start ==
      (long)(this->columns).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->columns).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    Record::Record(&r);
    Record::create_from_vector(&r,fields);
    record_number = Record::append_to_file(&r,&f);
    pacVar6 = r.buffer;
    lVar3 = 0;
    for (uVar4 = 0;
        pbVar1 = (this->columns).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(this->columns).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
        uVar4 = uVar4 + 1) {
      this_00 = Index::operator[](&this->index,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3)
                                 );
      std::__cxx11::string::string((string *)&local_3f8,*pacVar6,&local_401);
      this_01 = MultiMap::
                MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                ::at(this_00,&local_3f8);
      std::vector<long,_std::allocator<long>_>::push_back(this_01,&record_number);
      std::__cxx11::string::~string((string *)&local_3f8);
      lVar3 = lVar3 + 0x20;
      pacVar6 = pacVar6 + 1;
    }
    std::fstream::close();
    std::fstream::~fstream(&f);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,this->MISMATCHED_COL_NUM);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Table::insert_into(const std::vector<std::string>& fields) {
    // check field lengths, because the technology isnt here for this yet
    for (size_t i = 0; i < fields.size(); ++i) {
        if (fields[i].size() >= constants::MAX_BLOCK_COLS)
            throw std::runtime_error(MAX_FIELD_SIZE_EXCEEDED + fields[i]);
    }
    if(!bin_io::file_exists(get_filename().c_str()))
        throw std::runtime_error(CANNOT_FIND_TABLE);
    std::fstream f;
    bin_io::open_fileW(f, get_filename().c_str());
    if (fields.size() != columns.size()) {
        throw std::runtime_error(MISMATCHED_COL_NUM);
    }
    Record r;
    r.create_from_vector(fields);
    long record_number = r.append_to_file(f);
    // update the index
    for (size_t i = 0; i < columns.size(); ++i) {
        index[columns[i]][r.buffer[i]] += record_number;
    }
    f.close();
}